

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O0

uint8_t bit_reader_read(bit_reader_t *r,uint n)

{
  size_t sVar1;
  size_t sVar2;
  byte bVar3;
  uint8_t copy_mask;
  uint n_copy;
  uint read;
  uint n_local;
  bit_reader_t *r_local;
  
  read = 0;
  n_local = n;
  if (r->current_byte_len < (ulong)n) {
    bVar3 = r->current_byte;
    sVar1 = r->current_byte_len;
    r->byte_index = r->byte_index + 1;
    r->current_byte = r->bytes[r->byte_index];
    n_local = n - (int)r->current_byte_len;
    r->current_byte_len = 8;
    read = ((uint)bVar3 & (1 << ((byte)sVar1 & 0x1f)) - 1U) << ((byte)n_local & 0x1f);
  }
  bVar3 = (byte)n_local;
  sVar1 = r->current_byte_len;
  sVar2 = r->current_byte_len;
  r->current_byte_len = r->current_byte_len - (ulong)n_local;
  return (uint8_t)((int)(uint)reverse_table
                              [(int)(uint)(r->current_byte &
                                          (char)(1 << (bVar3 & 0x1f)) + -1 <<
                                          ((char)sVar1 - bVar3 & 0x1f)) >>
                               ((char)sVar2 - bVar3 & 0x1f) | read] >> (8U - (char)n & 0x1f));
}

Assistant:

uint8_t bit_reader_read(bit_reader_t *r, unsigned int n) {
    unsigned int read = 0;
    unsigned int n_copy = n;

    if (r->current_byte_len < n) {
        read = r->current_byte & ((1 << r->current_byte_len) - 1);
        r->byte_index++;
        r->current_byte = r->bytes[r->byte_index];
        n -= r->current_byte_len;
        r->current_byte_len = 8;
        read <<= n;
    }

    uint8_t copy_mask = (1 << n) - 1;
    copy_mask <<= (r->current_byte_len - n);
    read |= (r->current_byte & copy_mask) >> (r->current_byte_len - n);
    r->current_byte_len -= n;
    return reverse_table[read] >> (8 - n_copy);
}